

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::SignalSemaphore
          (VulkanLogicalDevice *this,VkSemaphoreSignalInfo *SignalInfo)

{
  VkResult VVar1;
  char (*in_RCX) [60];
  string msg;
  string local_38;
  
  if (SignalInfo->sType != VK_STRUCTURE_TYPE_SEMAPHORE_SIGNAL_INFO) {
    Diligent::FormatString<char[26],char[60]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SignalInfo.sType == VK_STRUCTURE_TYPE_SEMAPHORE_SIGNAL_INFO",in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SignalSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2a3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  VVar1 = (*vkSignalSemaphoreKHR)(this->m_VkDevice,SignalInfo);
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::SignalSemaphore(const VkSemaphoreSignalInfo& SignalInfo) const
{
#if DILIGENT_USE_VOLK
    VERIFY_EXPR(SignalInfo.sType == VK_STRUCTURE_TYPE_SEMAPHORE_SIGNAL_INFO);
    return vkSignalSemaphoreKHR(m_VkDevice, &SignalInfo);
#else
    UNSUPPORTED("vkSignalSemaphoreKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}